

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9GenCompileError(jx9_gen_state *pGen,sxi32 nErrType,sxu32 nLine,char *zFormat,...)

{
  char in_AL;
  uint uVar1;
  char *pcVar2;
  SyBlob *pBlob;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sxu32 n;
  va_list ap;
  sxu32 local_ec;
  __va_list_tag local_e8;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  pBlob = &(pGen->pVm->pEngine->xConf).sErrConsumer;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (nErrType == 2) {
    pcVar2 = "Warning";
  }
  else {
    pcVar2 = "Error";
    if ((nErrType == 1) && (uVar1 = pGen->nErr + 1, pGen->nErr = uVar1, 0xf < uVar1)) {
      SyBlobFormat(pBlob,"%u Error count limit reached, JX9 is aborting compilation\n",_nLine,
                   "Error");
      return -10;
    }
  }
  SyBlobFormat(pBlob,"%u %s: ",_nLine,pcVar2);
  local_e8.reg_save_area = local_c8;
  local_e8.overflow_arg_area = &stack0x00000008;
  local_e8.gp_offset = 0x20;
  local_e8.fp_offset = 0x30;
  local_ec = 0;
  FormatMount(6,pBlob,(ProcConsumer)0x0,(void *)0x0,&local_ec,zFormat,&local_e8);
  SyBlobAppend(pBlob,"\n",1);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9GenCompileError(jx9_gen_state *pGen,sxi32 nErrType,sxu32 nLine,const char *zFormat,...)
{
	SyBlob *pWorker = &pGen->pVm->pEngine->xConf.sErrConsumer;
	const char *zErr = "Error";
	va_list ap;
	if( nErrType == E_ERROR ){
		/* Increment the error counter */
		pGen->nErr++;
		if( pGen->nErr > 15 ){
			/* Error count limit reached */
			SyBlobFormat(pWorker, "%u Error count limit reached, JX9 is aborting compilation\n", nLine);	
			/* Abort immediately */
			return SXERR_ABORT;
		}
	}
	switch(nErrType){
	case E_WARNING: zErr = "Warning";     break;
	case E_PARSE:   zErr = "Parse error"; break;
	case E_NOTICE:  zErr = "Notice";      break;
	default:
		break;
	}
	/* Format the error message */
	SyBlobFormat(pWorker, "%u %s: ", nLine, zErr);
	va_start(ap, zFormat);
	SyBlobFormatAp(pWorker, zFormat, ap);
	va_end(ap);
	/* Append a new line */
	SyBlobAppend(pWorker, (const void *)"\n", sizeof(char));
	return JX9_OK;
}